

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BindTypeOfFunctionExpression(duckdb *this,FunctionBindExpressionInput *input)

{
  reference this_00;
  pointer pEVar1;
  BoundConstantExpression *this_01;
  string local_b8;
  Value local_98;
  Value local_58;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](input->children,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  if ((byte)((pEVar1->return_type).id_ - SQLNULL) < 2) {
    *(undefined8 *)this = 0;
  }
  else {
    LogicalType::ToString_abi_cxx11_(&local_b8,&pEVar1->return_type);
    Value::Value(&local_98,&local_b8);
    this_01 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_58,&local_98);
    BoundConstantExpression::BoundConstantExpression(this_01,&local_58);
    Value::~Value(&local_58);
    *(BoundConstantExpression **)this = this_01;
    Value::~Value(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BindTypeOfFunctionExpression(FunctionBindExpressionInput &input) {
	auto &return_type = input.children[0]->return_type;
	if (return_type.id() == LogicalTypeId::UNKNOWN || return_type.id() == LogicalTypeId::SQLNULL) {
		// parameter - unknown return type
		return nullptr;
	}
	// emit a constant expression
	return make_uniq<BoundConstantExpression>(Value(return_type.ToString()));
}